

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film_grain_table_test.cc
# Opt level: O1

void __thiscall
FilmGrainTableIOTest_ReadTruncatedFile_Test::TestBody
          (FilmGrainTableIOTest_ReadTruncatedFile_Test *this)

{
  undefined8 *puVar1;
  bool in_SIL;
  SEARCH_METHODS *pSVar2;
  AssertionResult gtest_ar;
  FILE *file;
  string grain_file;
  aom_film_grain_table_t table;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  AssertHelper local_68;
  internal local_60 [8];
  undefined8 *local_58;
  FILE *local_50;
  string local_48;
  aom_film_grain_table_t local_28;
  
  local_28.head = (aom_film_grain_table_entry_t *)0x0;
  local_28.tail = (aom_film_grain_table_entry_t *)0x0;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_50 = (FILE *)libaom_test::GetTempOutFile(&local_48,in_SIL);
  local_70._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<_IO_FILE*,decltype(nullptr)>
            (local_60,"file","nullptr",(_IO_FILE **)&local_50,&local_70._M_head_impl);
  puVar1 = local_58;
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_58 == (undefined8 *)0x0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = (SEARCH_METHODS *)*local_58;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
               ,0xcc,(char *)pSVar2);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
  }
  else {
    if (local_58 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_58 != local_58 + 2) {
        operator_delete((undefined8 *)*local_58);
      }
      operator_delete(puVar1);
    }
    fwrite("deadbeef",8,1,local_50);
    fclose(local_50);
    local_70._M_head_impl._0_4_ = 1;
    local_68.data_._0_4_ =
         aom_film_grain_table_read
                   (&local_28,local_48._M_dataplus._M_p,&(this->super_FilmGrainTableIOTest).error_);
    testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
              (local_60,"AOM_CODEC_ERROR",
               "aom_film_grain_table_read(&table, grain_file.c_str(), &error_)",
               (aom_codec_err_t *)&local_70,(aom_codec_err_t *)&local_68);
    puVar1 = local_58;
    if (local_60[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      if (local_58 == (undefined8 *)0x0) {
        pSVar2 = "";
      }
      else {
        pSVar2 = (SEARCH_METHODS *)*local_58;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
                 ,0xd0,(char *)pSVar2);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
    }
    else {
      if (local_58 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_58 != local_58 + 2) {
          operator_delete((undefined8 *)*local_58);
        }
        operator_delete(puVar1);
      }
      local_70._M_head_impl = local_70._M_head_impl & 0xffffffff00000000;
      local_68.data_._0_4_ = remove(local_48._M_dataplus._M_p);
      testing::internal::CmpHelperEQ<int,int>
                (local_60,"0","remove(grain_file.c_str())",(int *)&local_70,(int *)&local_68);
      if (local_60[0] != (internal)0x0) goto LAB_004eb4a1;
      testing::Message::Message((Message *)&local_70);
      if (local_58 == (undefined8 *)0x0) {
        pSVar2 = "";
      }
      else {
        pSVar2 = (SEARCH_METHODS *)*local_58;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
                 ,0xd1,(char *)pSVar2);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_68);
  if (local_70._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_70._M_head_impl + 8))();
  }
LAB_004eb4a1:
  if (local_58 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_58 != local_58 + 2) {
      operator_delete((undefined8 *)*local_58);
    }
    operator_delete(local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_F(FilmGrainTableIOTest, ReadTruncatedFile) {
  aom_film_grain_table_t table;
  memset(&table, 0, sizeof(table));

  std::string grain_file;
  FILE *file = libaom_test::GetTempOutFile(&grain_file);
  ASSERT_NE(file, nullptr);
  fwrite("deadbeef", 8, 1, file);
  fclose(file);
  ASSERT_EQ(AOM_CODEC_ERROR,
            aom_film_grain_table_read(&table, grain_file.c_str(), &error_));
  EXPECT_EQ(0, remove(grain_file.c_str()));
}